

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_write_dirty_pages(Pager *pPager,Page *pDirty)

{
  Page *pPVar1;
  Page *pNext;
  Page *pPStack_18;
  int rc;
  Page *pDirty_local;
  Pager *pPager_local;
  
  pNext._4_4_ = 0;
  pPVar1 = pDirty;
  while ((pPStack_18 = pPVar1, pPStack_18 != (Page *)0x0 &&
         ((pPVar1 = pPStack_18->pDirtyPrev, (pPStack_18->flags & 8U) != 0 ||
          (pNext._4_4_ = unqliteOsWrite(pPager->pfd,pPStack_18->zData,(long)pPager->iPageSize,
                                        pPStack_18->pgno * (long)pPager->iPageSize),
          pNext._4_4_ == 0))))) {
    pPStack_18->flags = pPStack_18->flags & 0xffffff91;
    if (pPStack_18->nRef < 1) {
      pager_unlink_page(pPager,pPStack_18);
      pager_release_page(pPager,pPStack_18);
    }
  }
  pPager->pFirstDirty = (Page *)0x0;
  pPager->pDirty = (Page *)0x0;
  pPager->pFirstHot = (Page *)0x0;
  pPager->pHotDirty = (Page *)0x0;
  pPager->nHot = 0;
  return pNext._4_4_;
}

Assistant:

static int pager_write_dirty_pages(Pager *pPager,Page *pDirty)
{
	int rc = UNQLITE_OK;
	Page *pNext;
	for(;;){
		if( pDirty == 0 ){
			break;
		}
		/* Point to the next dirty page */
		pNext = pDirty->pDirtyPrev; /* Not a bug: Reverse link */
		if( (pDirty->flags & PAGE_DONT_WRITE) == 0 ){
			rc = unqliteOsWrite(pPager->pfd,pDirty->zData,pPager->iPageSize,pDirty->pgno * pPager->iPageSize);
			if( rc != UNQLITE_OK ){
				/* A rollback should be done */
				break;
			}
		}
		/* Remove stale flags */
		pDirty->flags &= ~(PAGE_DIRTY|PAGE_DONT_WRITE|PAGE_NEED_SYNC|PAGE_IN_JOURNAL|PAGE_HOT_DIRTY);
		if( pDirty->nRef < 1 ){
			/* Unlink the page now it is unused */
			pager_unlink_page(pPager,pDirty);
			/* Release the page */
			pager_release_page(pPager,pDirty);
		}
		/* Point to the next page */
		pDirty = pNext;
	}
	pPager->pDirty = pPager->pFirstDirty = 0;
	pPager->pHotDirty = pPager->pFirstHot = 0;
	pPager->nHot = 0;
	return rc;
}